

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.h
# Opt level: O1

ostream * wavingz::zwave_print<unsigned_char*>(ostream *out,uchar *data_begin,uchar *data_end)

{
  long lVar1;
  ostream oVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  ulong uVar4;
  ostream *poVar5;
  byte bVar6;
  byte *pbVar7;
  long lVar8;
  char *pcVar9;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (data_begin != data_end) {
    pbVar7 = data_begin;
    do {
      lVar8 = *(long *)out;
      lVar1 = *(long *)(lVar8 + -0x18);
      *(uint *)(out + lVar1 + 0x18) = *(uint *)(out + lVar1 + 0x18) & 0xffffffb5 | 8;
      lVar8 = *(long *)(lVar8 + -0x18);
      poVar3 = out + lVar8;
      if (out[lVar8 + 0xe1] == (ostream)0x0) {
        oVar2 = (ostream)std::ios::widen((char)poVar3);
        poVar3[0xe0] = oVar2;
        poVar3[0xe1] = (ostream)0x1;
      }
      poVar3[0xe0] = (ostream)0x30;
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 2;
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)out,(uint)*pbVar7);
      uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)((long)&uStack_38 + 7),1);
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != data_end);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  if (data_begin != (uchar *)0x0) {
    uVar4 = (ulong)data_begin[7];
    if ((9 < (ulong)((long)data_end - (long)data_begin) && uVar4 != 0) &&
       (uVar4 <= (ulong)((long)data_end - (long)data_begin))) {
      if (data_begin + (uVar4 - 1) == data_begin) {
        bVar6 = 0xff;
      }
      else {
        bVar6 = 0xff;
        lVar8 = 0;
        do {
          bVar6 = bVar6 ^ data_begin[lVar8];
          lVar8 = lVar8 + 1;
        } while (uVar4 - 1 != lVar8);
      }
      pcVar9 = "[ ] ";
      if (bVar6 == data_begin[uVar4 - 1]) {
        pcVar9 = "[x] ";
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar9,4);
      lVar8 = *(long *)out;
      lVar1 = *(long *)(lVar8 + -0x18);
      *(uint *)(out + lVar1 + 0x18) = *(uint *)(out + lVar1 + 0x18) & 0xffffffb5 | 8;
      lVar8 = *(long *)(lVar8 + -0x18);
      poVar3 = out + lVar8;
      if (out[lVar8 + 0xe1] == (ostream)0x0) {
        oVar2 = (ostream)std::ios::widen((char)poVar3);
        poVar3[0xe0] = oVar2;
        poVar3[0xe1] = (ostream)0x1;
      }
      poVar3[0xe0] = (ostream)0x30;
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 2;
      std::__ostream_insert<char,std::char_traits<char>>(out,"HomeId: ",8);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", SourceNodeId: ",0x10);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(uint)data_begin[4]);
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", FC0: ",7);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(uint)data_begin[5]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", FC1: ",7);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(uint)data_begin[6]);
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", FC[speed=",0xb);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," low_power=",0xb);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ack_request=",0xd);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," header_type=",0xd);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," beaming_info=",0xe);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," seq=",5);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"], Length: ",0xb);
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(uint)data_begin[7]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", DestNodeId: ",0xe);
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(uint)data_begin[8]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", CommandClass: ",0x10);
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(uint)data_begin[9]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", Payload: ",0xb);
      lVar8 = *(long *)poVar5;
      lVar1 = *(long *)(lVar8 + -0x18);
      *(uint *)(poVar5 + lVar1 + 0x18) = *(uint *)(poVar5 + lVar1 + 0x18) & 0xffffffb5 | 8;
      lVar8 = *(long *)(lVar8 + -0x18);
      poVar3 = poVar5 + lVar8;
      if (poVar5[lVar8 + 0xe1] == (ostream)0x0) {
        oVar2 = (ostream)std::ios::widen((char)poVar3);
        poVar3[0xe0] = oVar2;
        poVar3[0xe1] = (ostream)0x1;
      }
      poVar3[0xe0] = (ostream)0x30;
      if (data_begin[7] < 0xc) {
        return out;
      }
      lVar8 = 10;
      do {
        *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 2;
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)out,(uint)data_begin[lVar8]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        lVar8 = lVar8 + 1;
      } while (lVar8 < (long)((ulong)data_begin[7] - 1));
      return out;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"[ ] ",4);
  return out;
}

Assistant:

inline std::ostream&
zwave_print(std::ostream& out, It data_begin, It data_end)
{
    for(auto ch = data_begin; ch != data_end; ++ch)
        out << std::hex << std::setfill('0') << std::setw(2) << (int)*ch << ' ';
    out << std::endl;

    size_t len = data_end - data_begin;
    packet_t& p = *(packet_t*)data_begin;
    if (data_begin == 0 || p.length == 0 || len < sizeof(packet_t) || len < p.length)
    {
        out << "[ ] ";
        return out;
    }
    else if (checksum(data_begin, data_begin + (size_t)p.length - 1) !=
             data_begin[p.length - 1])
    {
        out << "[ ] ";
    }
    else
    {
        out << "[x] ";
    }
    out << std::hex << std::setfill('0') << std::setw(2)
        << "HomeId: " << ((uint32_t)p.home_id3 | p.home_id2 << 8 |
                          p.home_id1 << 16 | p.home_id0 << 24)
        << ", SourceNodeId: " << (int)p.source_node_id << std::hex
        << ", FC0: " << (int)p.fc0 << ", FC1: " << (int)p.fc1 << std::dec
        << ", FC[speed=" << p.frame_control_0.speed
        << " low_power=" << p.frame_control_0.low_power
        << " ack_request=" << p.frame_control_0.ack_request
        << " header_type=" << p.frame_control_0.header_type
        << " beaming_info=" << p.frame_control_1.beaming_info
        << " seq=" << p.frame_control_1.sequence_number
        << "], Length: " << std::dec << (int)p.length
        << ", DestNodeId: " << std::dec << (int)p.dest_node_id
        << ", CommandClass: " << std::hex << (int)p.command_class
        << ", Payload: " << std::hex << std::setfill('0');
    for (int i = sizeof(packet_t); i < p.length - 1; i++) {
        out << std::setw(2) << (int)data_begin[i] << " ";
    }
    return out;
}